

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O3

int jpc_enc_enccblks(jpc_enc_t *enc)

{
  jas_matrix_t *pjVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  jpc_enc_tcmpt_t *pjVar5;
  jpc_enc_rlvl_t *pjVar6;
  jpc_enc_band_t *pjVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  jpc_enc_band_t *band;
  long lVar13;
  long lVar14;
  long lVar15;
  jpc_enc_prc_t *pjVar16;
  jpc_enc_cblk_t *cblk;
  jpc_enc_tcmpt_t *tcmpt;
  jpc_enc_rlvl_t *pjVar17;
  jpc_enc_cblk_t *pjVar18;
  
  uVar12 = (ulong)enc->curtile->numtcmpts;
  if (uVar12 != 0) {
    tcmpt = enc->curtile->tcmpts;
    pjVar5 = tcmpt + uVar12;
    do {
      if ((ulong)tcmpt->numrlvls != 0) {
        pjVar17 = tcmpt->rlvls;
        pjVar6 = pjVar17 + tcmpt->numrlvls;
        do {
          band = pjVar17->bands;
          if ((band != (jpc_enc_band_t *)0x0) && ((ulong)pjVar17->numbands != 0)) {
            pjVar7 = band + pjVar17->numbands;
            do {
              if ((band->data != (jas_matrix_t *)0x0) && (uVar9 = pjVar17->numprcs, uVar9 != 0)) {
                pjVar16 = band->prcs;
                uVar12 = 0;
                do {
                  cblk = pjVar16->cblks;
                  if ((cblk != (jpc_enc_cblk_t *)0x0) &&
                     (uVar8 = (ulong)pjVar16->numcblks, uVar8 != 0)) {
                    lVar11 = uVar8 * 0x68;
                    pjVar18 = cblk;
                    do {
                      pjVar1 = pjVar18->data;
                      if (pjVar1->numrows_ < 1) {
                        lVar10 = 0;
                      }
                      else {
                        lVar13 = 0;
                        lVar10 = 0;
                        do {
                          if (0 < pjVar1->numcols_) {
                            lVar15 = 0;
                            lVar14 = lVar10;
                            do {
                              lVar2 = pjVar1->rows_[lVar13][lVar15];
                              lVar10 = -lVar2;
                              if (0 < lVar2) {
                                lVar10 = lVar2;
                              }
                              if (lVar10 <= lVar14) {
                                lVar10 = lVar14;
                              }
                              lVar15 = lVar15 + 1;
                              lVar14 = lVar10;
                            } while (pjVar1->numcols_ != lVar15);
                          }
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != pjVar1->numrows_);
                      }
                      iVar3 = jpc_fix_firstone(lVar10);
                      iVar4 = iVar3 + -5;
                      if (iVar3 < 6) {
                        iVar4 = 0;
                      }
                      pjVar18->numbps = iVar4;
                      pjVar18 = pjVar18 + 1;
                    } while (pjVar18 != cblk + uVar8);
                    if (uVar8 != 0) {
                      iVar4 = band->numbps;
                      lVar10 = 0;
                      do {
                        iVar3 = iVar4 - *(int *)((long)&cblk->numbps + lVar10);
                        *(int *)((long)&cblk->numimsbs + lVar10) = iVar3;
                        if (iVar3 < 0) {
                          __assert_fail("cblk->numimsbs >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                        ,0xa1,"int jpc_enc_enccblks(jpc_enc_t *)");
                        }
                        lVar10 = lVar10 + 0x68;
                      } while (lVar11 - lVar10 != 0);
                      if (uVar8 != 0) {
                        do {
                          iVar4 = jpc_enc_enccblk(tcmpt,band,cblk);
                          if (iVar4 != 0) {
                            return -1;
                          }
                          cblk = cblk + 1;
                          lVar11 = lVar11 + -0x68;
                        } while (lVar11 != 0);
                        uVar9 = pjVar17->numprcs;
                      }
                    }
                  }
                  uVar12 = uVar12 + 1;
                  pjVar16 = pjVar16 + 1;
                } while (uVar12 < uVar9);
              }
              band = band + 1;
            } while (band != pjVar7);
          }
          pjVar17 = pjVar17 + 1;
        } while (pjVar17 != pjVar6);
      }
      tcmpt = tcmpt + 1;
    } while (tcmpt != pjVar5);
  }
  return 0;
}

Assistant:

int jpc_enc_enccblks(jpc_enc_t *enc)
{
	jpc_enc_tcmpt_t *tcmpt;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_fix_t mx;
	jpc_fix_t bmx;
	jpc_fix_t v;
	jpc_enc_tile_t *tile;
	uint_fast32_t prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (tcmpt = tile->tcmpts; tcmpt != endcomps; ++tcmpt) {
		endlvls = &tcmpt->rlvls[tcmpt->numrlvls];
		for (lvl = tcmpt->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					bmx = 0;
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						mx = 0;
						for (jas_matind_t i = 0; i < jas_matrix_numrows(cblk->data); ++i) {
							for (jas_matind_t j = 0; j < jas_matrix_numcols(cblk->data); ++j) {
								v = JAS_ABS(jas_matrix_get(cblk->data, i, j));
								if (v > mx) {
									mx = v;
								}
							}
						}
						if (mx > bmx) {
							bmx = mx;
						}
						cblk->numbps = JAS_MAX(jpc_fix_firstone(mx) + 1 - JPC_NUMEXTRABITS, 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->numimsbs = band->numbps - cblk->numbps;
						assert(cblk->numimsbs >= 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						if (jpc_enc_enccblk(tcmpt, band, cblk)) {
							return -1;
						}
					}
				}
			}
		}
	}
	return 0;
}